

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::ConcatenateColumns::forward_impl
          (ConcatenateColumns *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  int numCols;
  pointer ppTVar1;
  pointer ppTVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> xi;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_c0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_a0;
  Type local_80;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)ppTVar2 - (long)ppTVar1) < 0x1000) {
    uVar5 = 0;
    for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)ppTVar2 - (long)ppTVar1 >> 3);
        uVar3 = uVar3 + 1) {
      *(uint *)((long)(this->super_Node).aux_mem + uVar4 * 4) = uVar5;
      Tensor::operator*(&local_c0,ppTVar1[uVar4]);
      numCols = (int)local_c0.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_cols.m_value;
      Tensor::operator*(&local_a0,fx);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      middleCols<int>(&local_80,
                      (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)&local_a0,(ulong)uVar5,numCols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,true>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_80,&local_c0);
      uVar5 = uVar5 + numCols;
      ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    return;
  }
  __assert_fail("xs.size() < MAX_CONCAT_COLS_ARGS",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                ,0x48e,
                "virtual void cnn::ConcatenateColumns::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void ConcatenateColumns::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  unsigned c = 0;
  assert(xs.size() < MAX_CONCAT_COLS_ARGS);
  for (unsigned i = 0; i < xs.size(); ++i) {
    static_cast<unsigned*>(aux_mem)[i] = c;
#if HAVE_CUDA
    assert(xs[i]->d.cols() == 1);
    // CUBLAS matricies are column-major, so just copy the memory
    auto & xi = *xs[i];
    const unsigned rows = xi.d.rows();
    CUDA_CHECK(cudaMemcpyAsync(&fx.v[i*rows], &xi.v[0], sizeof(float) * rows, cudaMemcpyDeviceToDevice));
#else
    auto xi = **xs[i];
    int d = xi.cols();
    (*fx).middleCols(c, d) = xi;
    c += d;
#endif
  }
}